

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

size_t ll_size(ll_node *node)

{
  size_t length;
  
  length = 0;
  for (; node != (ll_node *)0x0; node = node->next) {
    length = length + 1;
  }
  return length;
}

Assistant:

size_t ll_size(const struct ll_node *node)
{
	size_t length = 0;
	struct ll_node *cur_node = (struct ll_node *)node;
	while (cur_node != NULL) {
		cur_node = cur_node->next;
		length++;
	}
	return length;
}